

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O0

string * testing::TestPartResult::ExtractSummary_abi_cxx11_(char *message)

{
  char *pcVar1;
  char *in_RSI;
  string *in_RDI;
  char *stack_trace;
  allocator<char> *__a;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  string *this;
  undefined2 in_stack_ffffffffffffffd0;
  byte bVar2;
  undefined5 in_stack_ffffffffffffffd3;
  char *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  byte bVar3;
  allocator<char> in_stack_ffffffffffffffe7;
  
  this = in_RDI;
  pcVar1 = strstr(in_RSI,"\nStack trace:\n");
  bVar3 = 0;
  bVar2 = 0;
  if (pcVar1 == (char *)0x0) {
    std::allocator<char>::allocator();
    bVar3 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffffe7,CONCAT16(1,in_stack_ffffffffffffffe0)),
               in_stack_ffffffffffffffd8,
               (allocator<char> *)
               CONCAT53(in_stack_ffffffffffffffd3,CONCAT12(bVar2,in_stack_ffffffffffffffd0)));
  }
  else {
    __a = (allocator<char> *)&stack0xffffffffffffffd3;
    std::allocator<char>::allocator();
    bVar2 = 1;
    std::__cxx11::string::string<char_const*,void>
              (this,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,__a);
  }
  if ((bVar2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd3);
  }
  if ((bVar3 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe7);
  }
  return in_RDI;
}

Assistant:

std::string TestPartResult::ExtractSummary(const char* message) {
  const char* const stack_trace = strstr(message, internal::kStackTraceMarker);
  return stack_trace == NULL ? message :
      std::string(message, stack_trace);
}